

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Scan_copy64(int g_a,int g_b,int g_sbit,int64_t lo,int64_t hi)

{
  pnga_scan_copy((long)g_a,(long)g_b,(long)g_sbit,lo + 1,hi + 1);
  return;
}

Assistant:

void GA_Scan_copy64(int g_a, int g_b, int g_sbit, int64_t lo,
                    int64_t hi)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_copy(a, b, s, alo, ahi);

}